

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O2

void __thiscall
Eigen::internal::CompressedStorage<float,_int>::resize
          (CompressedStorage<float,_int> *this,Index size,double reserveSizeFactor)

{
  Index size_00;
  
  if (this->m_allocatedSize < size) {
    size_00 = (long)((double)size * reserveSizeFactor) + size;
    if (0x7ffffffe < size_00) {
      size_00 = 0x7fffffff;
    }
    if (size_00 < size) {
      throw_std_bad_alloc();
    }
    reallocate(this,size_00);
  }
  this->m_size = size;
  return;
}

Assistant:

void resize(Index size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
      {
        Index realloc_size = (std::min<Index>)(NumTraits<StorageIndex>::highest(),  size + Index(reserveSizeFactor*double(size)));
        if(realloc_size<size)
          internal::throw_std_bad_alloc();
        reallocate(realloc_size);
      }
      m_size = size;
    }